

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t sysbvm_float64_parseString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  char *__nptr;
  sysbvm_object_tuple_t *psVar1;
  anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 aVar2;
  
  __nptr = (char *)malloc(stringSize + 1);
  memcpy(__nptr,string,stringSize);
  __nptr[stringSize] = '\0';
  aVar2 = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1)atof(__nptr);
  psVar1 = sysbvm_context_allocateByteTuple(context,(context->roots).float64Type,8);
  psVar1->field_1 = aVar2;
  free(__nptr);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_float64_parseString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    char *buffer = (char*)malloc(stringSize + 1);
    memcpy(buffer, string, stringSize);
    buffer[stringSize] = 0;

    sysbvm_tuple_t result = sysbvm_float64_parseCString(context, buffer);
    free(buffer);
    return result;
}